

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

EnclosingExpr * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::EnclosingExpr,char_const(&)[10],(anonymous_namespace)::Node*&,char_const(&)[2]>
          (Db *this,char (*args) [10],Node **args_1,char (*args_2) [2])

{
  Node *Infix_;
  EnclosingExpr *this_00;
  StringView local_48;
  StringView local_38;
  char (*local_28) [2];
  char (*args_local_2) [2];
  Node **args_local_1;
  char (*args_local) [10];
  Db *this_local;
  
  local_28 = args_2;
  args_local_2 = (char (*) [2])args_1;
  args_local_1 = (Node **)args;
  args_local = (char (*) [10])this;
  this_00 = (EnclosingExpr *)
            anon_unknown.dwarf_4447fb::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x38);
  StringView::StringView(&local_38,(char *)args_local_1);
  Infix_ = *(Node **)args_local_2;
  StringView::StringView(&local_48,*local_28);
  anon_unknown.dwarf_4447fb::EnclosingExpr::EnclosingExpr(this_00,local_38,Infix_,local_48);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }